

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O1

int __thiscall re2c::Go::init(Go *this,EVP_PKEY_CTX *ctx)

{
  State *x;
  bool bVar1;
  int in_EAX;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  BitMap *pBVar3;
  opt_t *poVar4;
  Dot *this_00;
  GoBitmap *this_01;
  Cpgoto *this_02;
  uint uVar5;
  Span *hspan;
  ulong uVar6;
  long lVar7;
  uint32_t hSpans;
  BitMap *local_50;
  State *local_40;
  
  hSpans = this->nSpans;
  if (hSpans == 0) {
    return in_EAX;
  }
  hspan = this->span;
  do {
    if (0x100 < hspan->ub) goto LAB_0011e947;
    hspan = hspan + 1;
    hSpans = hSpans - 1;
  } while (hSpans != 0);
  hspan = (Span *)0x0;
  hSpans = 0;
LAB_0011e947:
  if (this->nSpans == 0) {
    iVar2 = 0;
    local_50 = (BitMap *)0x0;
    local_40 = (State *)0x0;
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    lVar7 = 8;
    local_40 = (State *)0x0;
    local_50 = (BitMap *)0x0;
    iVar2 = 0;
    do {
      x = *(State **)((long)&this->span->ub + lVar7);
      if (((x->isBase == true) && (pBVar3 = BitMap::find(x), pBVar3 != (BitMap *)0x0)) &&
         (bVar1 = matches(pBVar3->go->span,pBVar3->go->nSpans,pBVar3->on,this->span,this->nSpans,
                          *(State **)((long)&this->span->ub + lVar7)), bVar1)) {
        if (local_50 == (BitMap *)0x0) {
          local_40 = *(State **)((long)&this->span->ub + lVar7);
          local_50 = pBVar3;
        }
        iVar2 = iVar2 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar5 = this->nSpans;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < uVar5);
  }
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (poVar4->target == DOT) {
    this->type = DOT;
    this_00 = (Dot *)operator_new(0x10);
    Dot::Dot(this_00,this->span,this->nSpans,(State *)ctx);
    iVar2 = extraout_EAX;
  }
  else {
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar4->gFlag == true) &&
       (poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868),
       poVar4->cGotoThreshold <= (uVar5 - iVar2) - hSpans)) {
      this->type = CPGOTO;
      this_02 = (Cpgoto *)operator_new(0x10);
      Cpgoto::Cpgoto(this_02,this->span,this->nSpans,hspan,hSpans,*(State **)(ctx + 0x10));
      (this->info).cpgoto = this_02;
      return extraout_EAX_01;
    }
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((iVar2 != 0 & poVar4->bFlag) == 1) {
      this->type = BITMAP;
      this_01 = (GoBitmap *)operator_new(0x20);
      GoBitmap::GoBitmap(this_01,this->span,this->nSpans,hspan,hSpans,local_50,local_40,
                         *(State **)(ctx + 0x10));
      (this->info).bitmap = this_01;
      bUsedYYBitmap = 1;
      return 0x15e380;
    }
    this->type = SWITCH_IF;
    this_00 = (Dot *)operator_new(0x10);
    SwitchIf::SwitchIf((SwitchIf *)this_00,this->span,this->nSpans,*(State **)(ctx + 0x10));
    iVar2 = extraout_EAX_00;
  }
  (this->info).dot = this_00;
  return iVar2;
}

Assistant:

void Go::init (const State * from)
{
	if (nSpans == 0)
	{
		return;
	}

	// initialize high (wide) spans
	uint32_t hSpans = 0;
	const Span * hspan = NULL;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		if (span[i].ub > 0x100)
		{
			hspan = &span[i];
			hSpans = nSpans - i;
			break;
		}
	}

	// initialize bitmaps
	uint32_t nBitmaps = 0;
	const BitMap * bitmap = NULL;
	const State * bitmap_state = NULL;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		if (span[i].to->isBase)
		{
			const BitMap *b = BitMap::find (span[i].to);
			if (b && matches(b->go->span, b->go->nSpans, b->on, span, nSpans, span[i].to))
			{
				if (bitmap == NULL)
				{
					bitmap = b;
					bitmap_state = span[i].to;
				}
				nBitmaps++;
			}
		}
	}

	const uint32_t dSpans = nSpans - hSpans - nBitmaps;
	if (opts->target == opt_t::DOT)
	{
		type = DOT;
		info.dot = new Dot (span, nSpans, from);
	}
	else if (opts->gFlag && (dSpans >= opts->cGotoThreshold))
	{
		type = CPGOTO;
		info.cpgoto = new Cpgoto (span, nSpans, hspan, hSpans, from->next);
	}
	else if (opts->bFlag && (nBitmaps > 0))
	{
		type = BITMAP;
		info.bitmap = new GoBitmap (span, nSpans, hspan, hSpans, bitmap, bitmap_state, from->next);
		bUsedYYBitmap = true;
	}
	else
	{
		type = SWITCH_IF;
		info.switchif = new SwitchIf (span, nSpans, from->next);
	}
}